

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall
helics::apps::App::processArgs
          (App *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app,
          FederateInfo *fedInfo,string_view defaultAppName)

{
  ParseOutput PVar1;
  bool bVar2;
  pointer phVar3;
  element_type *peVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  ParseOutput ret;
  undefined7 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  App *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x206999);
  CLI::App::remaining_for_passthrough_abi_cxx11_
            (in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff50,in_RDI);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff50);
  phVar3 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x2069de);
  PVar1 = phVar3->last_output;
  if (PVar1 == HELP_CALL) {
    *(undefined1 *)
     ((long)&in_RDI[5].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 1;
  }
  if (PVar1 == OK) {
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x206a2a);
    if ((bVar2) &&
       (((ulong)in_RDI[5].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0x100) == 0)) {
      in_stack_ffffffffffffff40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      CLI::Validator::operator()((Validator *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff3f =
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x206a8e);
      std::__cxx11::string::~string(in_stack_ffffffffffffff40);
      std::__cxx11::string::~string(in_stack_ffffffffffffff40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
      if ((in_stack_ffffffffffffff3f & 1) != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_ffffffffffffff40,
                  (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      }
    }
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x206b20);
    if (bVar2) {
      std::__cxx11::string::operator=
                (in_stack_ffffffffffffff40,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    }
    std::make_shared<helics::CombinationFederate,char_const(&)[1],helics::FederateInfo&>
              ((char (*) [1])in_stack_ffffffffffffff68,
               (FederateInfo *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    CLI::std::shared_ptr<helics::CombinationFederate>::operator=
              ((shared_ptr<helics::CombinationFederate> *)in_stack_ffffffffffffff40,
               (shared_ptr<helics::CombinationFederate> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    CLI::std::shared_ptr<helics::CombinationFederate>::~shared_ptr
              ((shared_ptr<helics::CombinationFederate> *)0x206b78);
    peVar4 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x206b86);
    Federate::getConfigFile_abi_cxx11_
              ((Federate *)
               ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  }
  else {
    *(undefined1 *)
     ((long)&in_RDI[5].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 2) = 1;
  }
  return;
}

Assistant:

void App::processArgs(std::unique_ptr<helicsCLI11App>& app,
                      FederateInfo& fedInfo,
                      std::string_view defaultAppName)
{
    remArgs = app->remaining_for_passthrough();
    auto ret = app->last_output;
    if (ret == helicsCLI11App::ParseOutput::HELP_CALL) {
        helpMode = true;
    }
    if (ret != helicsCLI11App::ParseOutput::OK) {
        deactivated = true;
        return;
    }

    if (inputFileName.empty()) {
        if (!fileLoaded) {
            if (CLI::ExistingFile("helics.json").empty()) {
                inputFileName = "helics.json";
            }
        }
    }

    if (fedInfo.defName.empty()) {
        fedInfo.defName = defaultAppName;
    }

    fed = std::make_shared<CombinationFederate>("", fedInfo);
    configFileName = fed->getConfigFile();
}